

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_multiclasstask.cc
# Opt level: O0

void MulticlassTask::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  __type_conflict _Var1;
  double dVar2;
  task_data *data;
  size_t *in_RSI;
  search *in_RDI;
  task_data *my_task_data;
  uint32_t in_stack_0000019c;
  search *in_stack_000001a0;
  uint *in_stack_ffffffffffffffc8;
  v_array<unsigned_int> *this;
  
  data = (task_data *)operator_new(0x30);
  (data->y_allowed).end_array = (uint *)0x0;
  (data->y_allowed).erase_count = 0;
  (data->y_allowed)._begin = (uint *)0x0;
  (data->y_allowed)._end = (uint *)0x0;
  data->max_label = 0;
  data->num_level = 0;
  Search::search::set_options(in_stack_000001a0,in_stack_0000019c);
  Search::search::set_num_learners(in_RDI,*in_RSI);
  data->max_label = *in_RSI;
  this = (v_array<unsigned_int> *)std::log<unsigned_long>(0x3dc0cb);
  _Var1 = std::log<int>(0);
  dVar2 = ceil((double)this / _Var1);
  data->num_level = (long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f;
  v_array<unsigned_int>::push_back(this,in_stack_ffffffffffffffc8);
  v_array<unsigned_int>::push_back(this,in_stack_ffffffffffffffc8);
  Search::search::set_task_data<MulticlassTask::task_data>(in_RDI,data);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, VW::config::options_i& /*vm*/)
{
  task_data* my_task_data = new task_data();
  sch.set_options(0);
  sch.set_num_learners(num_actions);
  my_task_data->max_label = num_actions;
  my_task_data->num_level = (size_t)ceil(log(num_actions) / log(2));
  my_task_data->y_allowed.push_back(1);
  my_task_data->y_allowed.push_back(2);
  sch.set_task_data(my_task_data);
}